

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmDivl<(moira::Instr)154,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  Dn dn;
  char *pcVar8;
  uint uVar9;
  Dn dn_00;
  bool bVar10;
  Ea<(moira::Mode)9,_4> src;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar6 = (*this->_vptr_Moira[6])();
  uVar9 = uVar6 & 0xffff;
  local_40 = op & 7;
  local_44 = *addr;
  *addr = local_44 + 2;
  local_3c = (*this->_vptr_Moira[6])(this);
  local_3c = local_3c & 0xffff;
  bVar10 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  pcVar8 = ":";
  if (bVar10) {
    pcVar8 = ",";
  }
  if ((uVar6 & 0x83f8) != 0 && bVar10) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)154,(moira::Mode)9,4>(this,str,addr,op);
    return;
  }
  cVar5 = 'd';
  lVar7 = 0;
  if ((uVar9 >> 0xb & 1) == 0) {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "divu"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
  }
  else {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "fddivs"[lVar7 + 3];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
  }
  dn_00.raw = uVar9 >> 0xc & 7;
  dn.raw = uVar6 & 7;
  if ((uVar9 >> 10 & 1) == 0) {
    if ((dn_00.raw == dn.raw) && (str->style->syntax == MUSASHI)) {
      cVar5 = '.';
      lVar7 = 0;
      do {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = cVar5;
        cVar5 = "$%x.l"[lVar7 + 4];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      StrWriter::operator<<(str,(Ea<(moira::Mode)9,_4> *)&local_44);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ',';
      SVar3 = str->style->syntax;
      dn_00.raw = dn.raw;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
    }
    else {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = 'l';
      if (str->style->syntax - MOIRA_MIT < 3) {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = 'l';
      }
      else {
        cVar5 = '.';
        lVar7 = 0;
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = cVar5;
          cVar5 = "$%x.l"[lVar7 + 4];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 2);
      }
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      StrWriter::operator<<(str,(Ea<(moira::Mode)9,_4> *)&local_44);
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      }
      StrWriter::operator<<(str,dn);
      cVar5 = *pcVar8;
      while (cVar5 != '\0') {
        pcVar8 = pcVar8 + 1;
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = *pcVar8;
      }
    }
  }
  else {
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = 'l';
    }
    else {
      cVar5 = '.';
      lVar7 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "$%x.l"[lVar7 + 4];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)9,_4> *)&local_44);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,dn);
    cVar5 = *pcVar8;
    while (cVar5 != '\0') {
      pcVar8 = pcVar8 + 1;
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = *pcVar8;
    }
  }
  StrWriter::operator<<(str,dn_00);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar5 = ';';
    lVar7 = 1;
    do {
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = cVar5;
      cVar5 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmDivl(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::DIVS>{} : str << Ins<Instr::DIVU>{};

            if (ext & 1 << 10) {

                // DIVS.L <ea>,Dr:Dq    (64-bit dividend)
                str << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

            } else {

                // DIVSL.L <ea>,Dr:Dq   (32-bit dividend)
                if (dl.raw == dh.raw && str.style.syntax == Syntax::MUSASHI) {
                    str << Sz<S>{} << str.tab << src << Sep{} << dh;
                } else {
                    str << "l" << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

                }
            }
            str << Av<I, M, S>{};
    }
}